

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O2

void __thiscall
llvm::function_ref<void_(llvm::Error)>::operator()
          (function_ref<void_(llvm::Error)> *this,Error *params)

{
  _func_void_intptr_t_Error *p_Var1;
  intptr_t iVar2;
  ulong local_18;
  
  p_Var1 = this->callback;
  iVar2 = this->callable;
  local_18 = (ulong)params->Payload | 1;
  params->Payload = (ErrorInfoBase *)0x0;
  (*p_Var1)(iVar2,(ErrorInfoBase *)&local_18);
  if ((long *)(local_18 & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(local_18 & 0xfffffffffffffffe) + 8))();
  }
  return;
}

Assistant:

Ret operator()(Params ...params) const {
    return callback(callable, std::forward<Params>(params)...);
  }